

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void argo::unparser::unparse(int fd,json *j,char *space,char *newline,char *indent,int indent_inc)

{
  undefined1 local_70 [8];
  unparser u;
  fd_writer w;
  int indent_inc_local;
  char *indent_local;
  char *newline_local;
  char *space_local;
  json *j_local;
  int fd_local;
  
  fd_writer::fd_writer((fd_writer *)&u.m_indent_inc,fd);
  unparser((unparser *)local_70,(writer *)&u.m_indent_inc,space,newline,indent,indent_inc);
  unparse((unparser *)local_70,j,0);
  fd_writer::~fd_writer((fd_writer *)&u.m_indent_inc);
  return;
}

Assistant:

void unparser::unparse(
        int        fd,
        const json &j,
        const char *space,
        const char *newline,
        const char *indent,
        int        indent_inc)
{
    fd_writer w(fd);
    unparser u(w, space, newline, indent, indent_inc);
    u.unparse(j, 0);
}